

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  long lVar1;
  uint uVar2;
  int *piVar3;
  Allocator *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  void *pvVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  uint uVar24;
  void *pvVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  void *pvVar36;
  int iVar37;
  int k;
  void *pvVar38;
  undefined1 (*pauVar39) [64];
  long lVar40;
  bool bVar41;
  void *pvVar42;
  undefined1 (*pauVar43) [64];
  ulong uVar44;
  void *pvVar45;
  void *pvVar46;
  long lVar47;
  ulong uVar48;
  void *pvVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar80 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar81 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar82 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar83 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar86 [32];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar87 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  int local_150;
  void *local_140;
  void *local_138;
  void *local_130;
  int local_128;
  int local_118;
  void *local_108;
  uint local_100;
  int local_e8;
  int local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_90;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar2 = (this->super_Convolution1D).kernel_w;
  lVar32 = (long)(int)uVar2;
  uVar44 = (ulong)uVar2;
  uVar31 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar2;
  uVar24 = (this->super_Convolution1D).num_output;
  uVar48 = (ulong)(int)uVar24;
  uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) /
           (long)(int)uVar24;
  uVar13 = (uint)uVar31;
  uVar50 = uVar31 & 0xffffffff;
  if ((long)uVar48 < 0x10) {
    uVar19 = uVar13;
    if ((int)uVar24 < 8) {
      if ((int)uVar24 < 4) {
        if ((int)uVar24 < 2) {
          uVar16 = uVar24;
          if ((int)uVar13 < 0x10) {
            if ((int)uVar13 < 8) {
              if ((int)uVar13 < 4) {
                uVar20 = uVar2;
                if (1 < (int)uVar13) {
                  uVar20 = uVar2 * 2;
                  uVar19 = (uVar13 & 1) + 1;
                }
              }
              else {
                uVar20 = uVar2 * 4;
                uVar19 = (uVar13 & 1) + 1 + (uint)((uVar13 >> 1 & 1) != 0);
              }
            }
            else {
              uVar20 = uVar2 * 8;
              uVar19 = (uVar13 & 1) + 1 + ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0)
              ;
            }
          }
          else {
            uVar20 = uVar2 << 4;
            uVar19 = (uVar13 & 1) + (int)(uVar50 >> 4) + (uint)((uVar13 >> 3 & 1) != 0) +
                     ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
          }
        }
        else {
          if ((int)uVar13 < 0x10) {
            if ((int)uVar13 < 8) {
              if ((int)uVar13 < 4) {
                if ((int)uVar13 < 2) {
                  uVar20 = uVar2 * 2;
                  uVar16 = (uVar24 & 1) + 1;
                  goto LAB_0052def3;
                }
                uVar20 = uVar2 * 4;
                uVar19 = (uVar13 & 1) + 1;
              }
              else {
                uVar19 = (uVar13 & 1) + 1 + (uint)((uVar13 >> 1 & 1) != 0);
                uVar20 = uVar2 * 8;
              }
            }
            else {
              uVar20 = uVar2 << 4;
              uVar19 = (uVar13 & 1) + 1 + ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0)
              ;
            }
          }
          else {
            uVar20 = uVar2 << 5;
            uVar19 = (uVar13 & 1) + (int)(uVar50 >> 4) + (uint)((uVar13 >> 3 & 1) != 0) +
                     ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
          }
          uVar16 = (uVar24 & 1) + 1;
        }
      }
      else {
        if ((int)uVar13 < 0x10) {
          if ((int)uVar13 < 8) {
            if ((int)uVar13 < 4) {
              if ((int)uVar13 < 2) {
                uVar20 = uVar2 * 4;
                uVar16 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
                goto LAB_0052def3;
              }
              uVar20 = uVar2 * 8;
              uVar19 = (uVar13 & 1) + 1;
            }
            else {
              uVar20 = uVar2 << 4;
              uVar19 = (uVar13 & 1) + 1 + (uint)((uVar13 >> 1 & 1) != 0);
            }
          }
          else {
            uVar20 = uVar2 << 5;
            uVar19 = (uVar13 & 1) + 1 + ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
          }
        }
        else {
          uVar20 = uVar2 << 6;
          uVar19 = (uVar13 & 1) + (int)(uVar50 >> 4) + (uint)((uVar13 >> 3 & 1) != 0) +
                   ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
        }
        uVar16 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
      }
    }
    else {
      if ((int)uVar13 < 0x10) {
        if ((int)uVar13 < 8) {
          if ((int)uVar13 < 4) {
            if ((int)uVar13 < 2) {
              uVar20 = uVar2 * 8;
              uVar16 = (uVar24 & 1) + 1 + (uVar24 >> 2 & 1) + (uint)((uVar24 >> 1 & 1) != 0);
              goto LAB_0052def3;
            }
            uVar20 = uVar2 << 4;
            uVar19 = (uVar13 & 1) + 1;
          }
          else {
            uVar20 = uVar2 << 5;
            uVar19 = (uVar13 & 1) + 1 + (uint)((uVar13 >> 1 & 1) != 0);
          }
        }
        else {
          uVar20 = uVar2 << 6;
          uVar19 = (uVar13 & 1) + 1 + ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
        }
      }
      else {
        uVar20 = uVar2 << 7;
        uVar19 = (uVar13 & 1) + (int)(uVar50 >> 4) + (uint)((uVar13 >> 3 & 1) != 0) +
                 ((uint)(uVar50 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
      }
      uVar16 = (uVar24 & 1) + 1 + (uVar24 >> 2 & 1) + (uint)((uVar24 >> 1 & 1) != 0);
    }
LAB_0052def3:
    Mat::create(&this->weight_data_tm,uVar20,uVar19,uVar16,4,(Allocator *)0x0);
    uVar31 = 0;
    goto LAB_0052defe;
  }
  if ((int)uVar13 < 0x10) {
    if (7 < (int)uVar13) {
      iVar26 = uVar2 << 7;
      uVar19 = (uVar13 & 1) + 1 + ((uint)(uVar31 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
      goto LAB_0052d24a;
    }
    if (3 < (int)uVar13) {
      iVar26 = uVar2 << 6;
      uVar19 = (uVar13 & 1) + 1 + (uint)((uVar13 >> 1 & 1) != 0);
      goto LAB_0052d24a;
    }
    if (1 < (int)uVar13) {
      iVar26 = uVar2 << 5;
      uVar19 = (uVar13 & 1) + 1;
      goto LAB_0052d24a;
    }
    iVar26 = uVar2 << 4;
    iVar15 = (uVar24 & 1) + (uVar24 >> 4) + (uint)((uVar24 >> 3 & 1) != 0) + (uVar24 >> 2 & 1) +
             (uint)((uVar24 >> 1 & 1) != 0);
    uVar19 = uVar13;
  }
  else {
    iVar26 = uVar2 << 8;
    uVar19 = (uVar13 & 1) + ((uint)(uVar31 >> 4) & 0xfffffff) + (uint)((uVar13 >> 3 & 1) != 0) +
             ((uint)(uVar31 >> 2) & 1) + (uint)((uVar13 >> 1 & 1) != 0);
LAB_0052d24a:
    iVar15 = (uVar24 & 1) + (uVar24 >> 4) + (uint)((uVar24 >> 3 & 1) != 0) + (uVar24 >> 2 & 1) +
             (uint)((uVar24 >> 1 & 1) != 0);
  }
  Mat::create(&this->weight_data_tm,iVar26,uVar19,iVar15,4,(Allocator *)0x0);
  iVar27 = uVar13 * uVar2;
  auVar55 = vpbroadcastd_avx512f();
  auVar55 = vpmulld_avx512f(auVar55,_DAT_005b4180);
  auVar56 = vpbroadcastd_avx512f();
  vpmulld_avx512f(auVar56,auVar55);
  iVar26 = iVar27 * 0xf;
  iVar37 = iVar27 * 0x10;
  lVar17 = (long)(int)(uVar2 << 4) * 4;
  iVar15 = iVar27 * 0xe;
  local_ac = iVar27 * 0xd;
  local_b0 = iVar27 * 0xc;
  local_c8 = uVar2 * uVar13;
  local_b4 = local_c8 * 0xb;
  local_b8 = local_c8 * 8;
  local_bc = local_c8 * 7;
  local_c0 = local_c8 * 9;
  local_c4 = local_c8 * 10;
  local_c8 = local_c8 * 6;
  iVar14 = uVar2 * uVar13;
  local_cc = iVar14 * 5;
  local_d0 = iVar14 * 4;
  local_d4 = iVar14 * 3;
  iVar14 = iVar14 * 2;
  lVar33 = (long)(int)(uVar2 * 2) * 4;
  lVar1 = lVar32 * 4;
  iVar21 = 0;
  uVar50 = 0;
  local_d8 = iVar27;
  do {
    pauVar43 = (undefined1 (*) [64])
               ((uVar50 >> 4) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
               (long)(this->weight_data_tm).data);
    local_130 = (this->super_Convolution1D).weight_data.data;
    if ((int)uVar13 < 0x10) {
      local_130 = (void *)((long)local_130 + (long)(iVar27 * (int)uVar50) * 4);
      uVar31 = 0;
    }
    else {
      pvVar46 = (void *)((long)iVar26 * 4 + (long)local_130);
      pvVar42 = (void *)((long)iVar15 * 4 + (long)local_130);
      pvVar49 = (void *)((long)local_ac * 4 + (long)local_130);
      pvVar18 = (void *)((long)local_b0 * 4 + (long)local_130);
      pvVar29 = (void *)((long)local_b4 * 4 + (long)local_130);
      pvVar45 = (void *)((long)local_c4 * 4 + (long)local_130);
      pvVar22 = (void *)((long)local_c0 * 4 + (long)local_130);
      pvVar38 = (void *)((long)local_b8 * 4 + (long)local_130);
      pvVar23 = (void *)((long)local_bc * 4 + (long)local_130);
      pvVar25 = (void *)((long)local_c8 * 4 + (long)local_130);
      local_138 = (void *)((long)local_cc * 4 + (long)local_130);
      local_108 = (void *)((long)local_d0 * 4 + (long)local_130);
      local_140 = (void *)((long)local_d4 * 4 + (long)local_130);
      pvVar36 = (void *)((long)iVar14 * 4 + (long)local_130);
      pvVar34 = (void *)((long)local_d8 * 4 + (long)local_130);
      local_130 = (void *)((long)iVar21 * 4 + (long)local_130);
      iVar11 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          do {
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)local_130 + lVar32 * 0x10 + lVar47));
            auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + lVar32 * 0x10 + lVar47));
            auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar36 + lVar32 * 0x10 + lVar47));
            auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)local_140 + lVar32 * 0x10 + lVar47));
            auVar59 = vgatherdps_avx512f(*(undefined4 *)((long)local_108 + lVar32 * 0x10 + lVar47));
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)local_138 + lVar32 * 0x10 + lVar47));
            auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar25 + lVar32 * 0x10 + lVar47));
            auVar62 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar23 + lVar32 * 0x10 + lVar47));
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar38 + lVar32 * 0x10 + lVar47));
            auVar64 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar22 + lVar32 * 0x10 + lVar47));
            auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar45 + lVar32 * 0x10 + lVar47));
            auVar66 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar29 + lVar32 * 0x10 + lVar47));
            auVar67 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar18 + lVar32 * 0x10 + lVar47));
            auVar68 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar49 + lVar32 * 0x10 + lVar47));
            vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar69 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar42 + lVar32 * 0x10 + lVar47));
            vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
            auVar70 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar46 + lVar32 * 0x10 + lVar47));
            auVar71 = vunpcklps_avx512f(auVar55,auVar56);
            auVar55 = vunpckhps_avx512f(auVar55,auVar56);
            auVar56 = vunpcklps_avx512f(auVar57,auVar58);
            auVar57 = vunpckhps_avx512f(auVar57,auVar58);
            auVar58 = vunpcklps_avx512f(auVar59,auVar60);
            auVar59 = vunpckhps_avx512f(auVar59,auVar60);
            auVar60 = vunpcklps_avx512f(auVar61,auVar62);
            auVar61 = vunpckhps_avx512f(auVar61,auVar62);
            auVar62 = vunpcklps_avx512f(auVar63,auVar64);
            auVar63 = vunpckhps_avx512f(auVar63,auVar64);
            auVar64 = vunpcklps_avx512f(auVar65,auVar66);
            auVar65 = vunpckhps_avx512f(auVar65,auVar66);
            auVar66 = vunpcklps_avx512f(auVar67,auVar68);
            auVar67 = vunpckhps_avx512f(auVar67,auVar68);
            auVar68 = vunpcklps_avx512f(auVar69,auVar70);
            auVar69 = vunpckhps_avx512f(auVar69,auVar70);
            auVar70 = vunpcklpd_avx512f(auVar71,auVar56);
            auVar56 = vunpckhpd_avx512f(auVar71,auVar56);
            auVar71 = vunpcklpd_avx512f(auVar55,auVar57);
            auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
            auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
            auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
            auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
            auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
            auVar61 = vunpcklpd_avx512f(auVar62,auVar64);
            auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
            auVar64 = vunpcklpd_avx512f(auVar63,auVar65);
            auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
            auVar65 = vunpcklpd_avx512f(auVar66,auVar68);
            auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
            auVar68 = vunpcklpd_avx512f(auVar67,auVar69);
            auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
            auVar69 = vshuff64x2_avx512f(auVar70,auVar57,0x88);
            auVar72 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
            auVar73 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
            auVar74 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
            auVar75 = vshuff64x2_avx512f(auVar71,auVar60,0x88);
            auVar76 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
            auVar77 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
            auVar78 = vshuff64x2_avx512f(auVar63,auVar67,0x88);
            auVar57 = vshuff64x2_avx512f(auVar70,auVar57,0xdd);
            in_ZMM8 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
            auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
            in_ZMM7 = vshuff64x2_avx512f(auVar71,auVar60,0xdd);
            in_ZMM9 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
            auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
            in_ZMM6 = vshuff64x2_avx512f(auVar63,auVar67,0xdd);
            in_ZMM10 = vshuff64x2_avx512f(auVar69,auVar72,0x88);
            in_ZMM11 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
            auVar59 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
            auVar60 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
            auVar61 = vshuff64x2_avx512f(auVar57,in_ZMM8,0x88);
            auVar62 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
            in_ZMM17 = vshuff64x2_avx512f(in_ZMM7,in_ZMM9,0x88);
            auVar63 = vshuff64x2_avx512f(auVar55,in_ZMM6,0x88);
            in_ZMM16 = vshuff64x2_avx512f(auVar69,auVar72,0xdd);
            auVar64 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
            auVar65 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
            auVar66 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
            in_ZMM4 = vshuff64x2_avx512f(auVar57,in_ZMM8,0xdd);
            auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
            in_ZMM5 = vshuff64x2_avx512f(in_ZMM7,in_ZMM9,0xdd);
            auVar55 = vshuff64x2_avx512f(auVar55,in_ZMM6,0xdd);
            *pauVar43 = in_ZMM10;
            pauVar43[1] = in_ZMM11;
            pauVar43[2] = auVar59;
            pauVar43[3] = auVar60;
            pauVar43[4] = auVar61;
            pauVar43[5] = auVar62;
            pauVar43[6] = in_ZMM17;
            pauVar43[7] = auVar63;
            pauVar43[8] = in_ZMM16;
            pauVar43[9] = auVar64;
            pauVar43[10] = auVar65;
            pauVar43[0xb] = auVar66;
            pauVar43[0xc] = in_ZMM4;
            pauVar43[0xd] = auVar56;
            pauVar43[0xe] = in_ZMM5;
            pauVar43[0xf] = auVar55;
            pauVar43 = pauVar43 + 0x10;
            lVar47 = lVar47 + 4;
          } while (uVar44 * 4 != lVar47);
        }
        local_130 = (void *)((long)local_130 + lVar17);
        iVar28 = iVar11 + 0x1f;
        pvVar46 = (void *)((long)pvVar46 + lVar17);
        pvVar42 = (void *)((long)pvVar42 + lVar17);
        pvVar49 = (void *)((long)pvVar49 + lVar17);
        pvVar18 = (void *)((long)pvVar18 + lVar17);
        pvVar29 = (void *)((long)pvVar29 + lVar17);
        pvVar45 = (void *)((long)pvVar45 + lVar17);
        pvVar22 = (void *)((long)pvVar22 + lVar17);
        pvVar38 = (void *)((long)pvVar38 + lVar17);
        pvVar23 = (void *)((long)pvVar23 + lVar17);
        pvVar25 = (void *)((long)pvVar25 + lVar17);
        local_138 = (void *)((long)local_138 + lVar17);
        local_108 = (void *)((long)local_108 + lVar17);
        local_140 = (void *)((long)local_140 + lVar17);
        pvVar36 = (void *)((long)pvVar36 + lVar17);
        pvVar34 = (void *)((long)pvVar34 + lVar17);
        iVar11 = iVar11 + 0x10;
      } while (iVar28 < (int)uVar13);
      uVar31 = (ulong)(uVar13 & 0xfffffff0);
    }
    uVar19 = (uint)uVar31 | 7;
    while (uVar20 = (uint)uVar31, (int)uVar19 < (int)uVar13) {
      if (0 < (int)uVar2) {
        uVar30 = 0;
        pvVar18 = local_130;
        do {
          pauVar39 = pauVar43;
          lVar47 = 0;
          pvVar22 = pvVar18;
          do {
            lVar35 = lVar47;
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar22 + uVar31 * 4));
            *(undefined1 (*) [64])((long)*pauVar39 + lVar35) = auVar55;
            pvVar22 = (void *)((long)pvVar22 + lVar1);
            lVar47 = lVar35 + 0x40;
          } while ((int)(lVar35 + 0x40) != 0x200);
          uVar30 = uVar30 + 1;
          pvVar18 = (void *)((long)pvVar18 + 4);
          pauVar43 = (undefined1 (*) [64])(pauVar39[1] + lVar35);
        } while (uVar30 != uVar44);
        pauVar43 = (undefined1 (*) [64])(pauVar39[1] + lVar35);
      }
      local_130 = (void *)((long)local_130 + (long)(int)(uVar2 * 8) * 4);
      uVar31 = (ulong)(uVar20 + 8);
      uVar19 = uVar20 + 0xf;
    }
    uVar20 = uVar20 | 3;
    while (uVar19 = (uint)uVar31, (int)uVar20 < (int)uVar13) {
      if (0 < (int)uVar2) {
        uVar30 = 0;
        pvVar18 = local_130;
        do {
          pauVar39 = pauVar43;
          lVar47 = 0;
          pvVar22 = pvVar18;
          do {
            lVar35 = lVar47;
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar22 + uVar31 * 4));
            *(undefined1 (*) [64])((long)*pauVar39 + lVar35) = auVar55;
            pvVar22 = (void *)((long)pvVar22 + lVar1);
            lVar47 = lVar35 + 0x40;
          } while ((int)(lVar35 + 0x40) != 0x100);
          uVar30 = uVar30 + 1;
          pvVar18 = (void *)((long)pvVar18 + 4);
          pauVar43 = (undefined1 (*) [64])(pauVar39[1] + lVar35);
        } while (uVar30 != uVar44);
        pauVar43 = (undefined1 (*) [64])(pauVar39[1] + lVar35);
      }
      local_130 = (void *)((long)local_130 + (long)(int)(uVar2 * 4) * 4);
      uVar31 = (ulong)(uVar19 + 4);
      uVar20 = uVar19 + 7;
    }
    if ((int)(uVar19 | 1) < (int)uVar13) {
      pvVar18 = (void *)((long)local_130 + lVar1);
      do {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          do {
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)local_130 + uVar31 * 4 + lVar47));
            *pauVar43 = auVar55;
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar18 + uVar31 * 4 + lVar47));
            pauVar43[1] = auVar55;
            pauVar43 = pauVar43 + 2;
            lVar47 = lVar47 + 4;
          } while (uVar44 * 4 != lVar47);
        }
        local_130 = (void *)((long)local_130 + lVar33);
        iVar11 = (int)uVar31;
        uVar19 = iVar11 + 2;
        pvVar18 = (void *)((long)pvVar18 + lVar33);
        uVar31 = (ulong)uVar19;
      } while (iVar11 + 3 < (int)uVar13);
    }
    if ((int)uVar19 < (int)uVar13) {
      do {
        pvVar18 = local_130;
        uVar31 = uVar44;
        if (0 < (int)uVar2) {
          do {
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar18 * 5));
            *pauVar43 = auVar55;
            pauVar43 = pauVar43 + 1;
            pvVar18 = (void *)((long)pvVar18 + 4);
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar13);
    }
    uVar31 = uVar50 + 0x10;
    uVar30 = uVar50 + 0x1f;
    iVar26 = iVar26 + iVar37;
    iVar15 = iVar15 + iVar37;
    local_ac = local_ac + iVar37;
    local_b0 = local_b0 + iVar37;
    local_b4 = local_b4 + iVar37;
    local_c4 = local_c4 + iVar37;
    local_c0 = local_c0 + iVar37;
    local_b8 = local_b8 + iVar37;
    local_bc = local_bc + iVar37;
    local_c8 = local_c8 + iVar37;
    local_cc = local_cc + iVar37;
    local_d0 = local_d0 + iVar37;
    local_d4 = local_d4 + iVar37;
    iVar14 = iVar14 + iVar37;
    local_d8 = local_d8 + iVar37;
    iVar21 = iVar21 + iVar37;
    uVar50 = uVar31;
  } while (uVar30 < uVar48);
LAB_0052defe:
  uVar19 = (uint)uVar31;
  if ((int)(uVar19 | 7) < (int)uVar24) {
    auVar53 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxbd_avx512f(_DAT_005a6a50);
    auVar53 = vpmulld_avx2(auVar53,auVar55._0_32_);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    auVar54 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar54,auVar53);
    local_90 = uVar13 & 0xfffffff0;
    local_138._0_4_ = uVar2 * uVar13;
    iVar26 = (int)local_138 * 8;
    iVar15 = (uVar19 + 6) * (int)local_138;
    iVar14 = (uVar19 + 5) * (int)local_138;
    local_138._0_4_ = (int)local_138 * (uVar19 | 7);
    lVar17 = (long)(int)(uVar2 << 4) * 4;
    local_e0 = uVar2 * uVar13;
    local_140._0_4_ = (uVar19 + 4) * local_e0;
    local_108._0_4_ = (uVar19 + 3) * local_e0;
    local_e0 = (uVar19 + 2) * local_e0;
    local_e8 = (uVar19 + 1) * uVar2 * uVar13;
    iVar21 = uVar19 * uVar2 * uVar13;
    lVar1 = uVar44 * 4;
    uVar50 = uVar31 & 0xffffffff;
    do {
      pauVar43 = (undefined1 (*) [64])
                 ((ulong)(((uint)(uVar50 >> 4) & 0xfffffff) + (uint)(((uint)uVar50 >> 3 & 1) != 0))
                  * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                 (long)(this->weight_data_tm).data);
      pvVar18 = (this->super_Convolution1D).weight_data.data;
      if ((int)uVar13 < 0x10) {
        uVar19 = 0;
      }
      else {
        pvVar23 = (void *)((long)(int)local_138 * 4 + (long)pvVar18);
        pvVar25 = (void *)((long)iVar15 * 4 + (long)pvVar18);
        pvVar46 = (void *)((long)iVar14 * 4 + (long)pvVar18);
        pvVar49 = (void *)((long)(int)(uint)local_140 * 4 + (long)pvVar18);
        pvVar22 = (void *)((long)(int)local_108 * 4 + (long)pvVar18);
        pvVar38 = (void *)((long)local_e0 * 4 + (long)pvVar18);
        pvVar29 = (void *)((long)local_e8 * 4 + (long)pvVar18);
        pvVar18 = (void *)((long)iVar21 * 4 + (long)pvVar18);
        iVar27 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar33 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar18 + lVar33) * 5));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar29 + lVar33) * 5));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar38 + lVar33) * 5));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar22 + lVar33) * 5));
              auVar59 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar49 + lVar33) * 5));
              auVar60 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar46 + lVar33) * 5));
              auVar61 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar25 + lVar33) * 5));
              auVar62 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar23 + lVar33) * 5));
              auVar63 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklps_avx512f(auVar59,auVar60);
              auVar59 = vunpckhps_avx512f(auVar59,auVar60);
              auVar60 = vunpcklps_avx512f(auVar61,auVar62);
              auVar61 = vunpckhps_avx512f(auVar61,auVar62);
              auVar62 = vunpcklpd_avx512f(auVar63,auVar56);
              auVar56 = vunpckhpd_avx512f(auVar63,auVar56);
              auVar63 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vunpcklpd_avx512f(auVar58,auVar60);
              auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
              auVar60 = vunpcklpd_avx512f(auVar59,auVar61);
              auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
              auVar61 = vshuff64x2_avx512f(auVar62,auVar57,0x88);
              auVar64 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
              auVar65 = vshuff64x2_avx512f(auVar63,auVar60,0x88);
              auVar66 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
              in_ZMM5 = vshuff64x2_avx512f(auVar62,auVar57,0xdd);
              auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
              in_ZMM6 = vshuff64x2_avx512f(auVar63,auVar60,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
              in_ZMM7 = vshuff64x2_avx512f(auVar61,auVar64,0x88);
              in_ZMM8 = vshuff64x2_avx512f(auVar65,auVar66,0x88);
              in_ZMM10 = vshuff64x2_avx512f(in_ZMM5,auVar56,0x88);
              in_ZMM11 = vshuff64x2_avx512f(in_ZMM6,auVar55,0x88);
              in_ZMM9 = vshuff64x2_avx512f(auVar61,auVar64,0xdd);
              auVar57 = vshuff64x2_avx512f(auVar65,auVar66,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar56,0xdd);
              auVar55 = vshuff64x2_avx512f(in_ZMM6,auVar55,0xdd);
              *pauVar43 = in_ZMM7;
              pauVar43[1] = in_ZMM8;
              pauVar43[2] = in_ZMM10;
              pauVar43[3] = in_ZMM11;
              pauVar43[4] = in_ZMM9;
              pauVar43[5] = auVar57;
              pauVar43[6] = in_ZMM4;
              pauVar43[7] = auVar55;
              pauVar43 = pauVar43 + 8;
              lVar33 = lVar33 + 4;
            } while (lVar1 - lVar33 != 0);
          }
          pvVar18 = (void *)((long)pvVar18 + lVar17);
          pvVar29 = (void *)((long)pvVar29 + lVar17);
          pvVar38 = (void *)((long)pvVar38 + lVar17);
          pvVar22 = (void *)((long)pvVar22 + lVar17);
          pvVar49 = (void *)((long)pvVar49 + lVar17);
          pvVar46 = (void *)((long)pvVar46 + lVar17);
          pvVar25 = (void *)((long)pvVar25 + lVar17);
          pvVar23 = (void *)((long)pvVar23 + lVar17);
          iVar37 = iVar27 + 0x1f;
          iVar27 = iVar27 + 0x10;
          uVar19 = local_90;
        } while (iVar37 < (int)uVar13);
      }
      uVar20 = uVar19 | 7;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar33 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar54 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar79 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
            auVar80 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
            auVar81 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
            auVar82 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
            auVar83 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
            auVar84 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
            auVar86 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vunpcklps_avx(auVar54,auVar79);
            auVar54 = vunpckhps_avx(auVar54,auVar79);
            auVar6 = vunpcklps_avx(auVar80,auVar81);
            auVar79 = vunpckhps_avx(auVar80,auVar81);
            auVar7 = vunpcklps_avx(auVar82,auVar83);
            auVar80 = vunpckhps_avx(auVar82,auVar83);
            auVar85 = vunpcklps_avx(auVar84,auVar86);
            auVar81 = vunpckhps_avx(auVar84,auVar86);
            auVar82 = vunpcklpd_avx(auVar53,auVar6);
            in_ZMM10 = ZEXT3264(auVar82);
            auVar53 = vunpckhpd_avx(auVar53,auVar6);
            auVar6 = vunpcklpd_avx(auVar54,auVar79);
            in_ZMM11 = ZEXT3264(auVar6);
            auVar54 = vunpckhpd_avx(auVar54,auVar79);
            auVar83 = vunpcklpd_avx(auVar7,auVar85);
            auVar79 = vunpckhpd_avx(auVar7,auVar85);
            auVar7 = vunpcklpd_avx(auVar80,auVar81);
            in_ZMM8 = ZEXT3264(auVar7);
            auVar80 = vunpckhpd_avx(auVar80,auVar81);
            in_ZMM7 = ZEXT3264(auVar80);
            auVar85._16_16_ = auVar83._0_16_;
            auVar85._0_16_ = auVar82._0_16_;
            in_ZMM9 = ZEXT3264(auVar85);
            auVar84._16_16_ = auVar79._0_16_;
            auVar84._0_16_ = auVar53._0_16_;
            auVar86._16_16_ = auVar7._0_16_;
            auVar86._0_16_ = auVar6._0_16_;
            auVar87._16_16_ = auVar80._0_16_;
            auVar87._0_16_ = auVar54._0_16_;
            auVar81 = vperm2f128_avx(auVar82,auVar83,0x31);
            in_ZMM5 = ZEXT3264(auVar81);
            auVar53 = vperm2f128_avx(auVar53,auVar79,0x31);
            in_ZMM4 = ZEXT3264(auVar53);
            auVar79 = vperm2f128_avx(auVar6,auVar7,0x31);
            in_ZMM6 = ZEXT3264(auVar79);
            auVar54 = vperm2f128_avx(auVar54,auVar80,0x31);
            *(undefined1 (*) [32])*pauVar43 = auVar85;
            *(undefined1 (*) [32])((long)*pauVar43 + 0x20) = auVar84;
            *(undefined1 (*) [32])pauVar43[1] = auVar86;
            *(undefined1 (*) [32])(pauVar43[1] + 0x20) = auVar87;
            *(undefined1 (*) [32])pauVar43[2] = auVar81;
            *(undefined1 (*) [32])(pauVar43[2] + 0x20) = auVar53;
            *(undefined1 (*) [32])pauVar43[3] = auVar79;
            *(undefined1 (*) [32])(pauVar43[3] + 0x20) = auVar54;
            pauVar43 = pauVar43 + 4;
            lVar33 = lVar33 + 4;
          } while (lVar1 - lVar33 != 0);
        }
        uVar20 = uVar19 + 0xf;
        uVar19 = uVar19 + 8;
      }
      uVar20 = uVar19 | 3;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          uVar31 = 0;
          do {
            pauVar39 = pauVar43;
            lVar33 = 0;
            do {
              auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
              auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
              in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar39 + lVar33) = auVar53;
              lVar33 = lVar33 + 0x20;
            } while ((int)lVar33 != 0x80);
            uVar31 = uVar31 + 1;
            pauVar43 = (undefined1 (*) [64])((long)*pauVar39 + lVar33);
          } while (uVar31 != uVar44);
          pauVar43 = (undefined1 (*) [64])((long)*pauVar39 + lVar33);
        }
        uVar20 = uVar19 + 7;
        uVar19 = uVar19 + 4;
      }
      uVar20 = uVar19 | 1;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar33 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            *(undefined1 (*) [32])*pauVar43 = auVar53;
            auVar53 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar53 = vgatherdps(ZEXT832(0) << 0x20,auVar53);
            in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])((long)*pauVar43 + 0x20) = auVar53;
            pauVar43 = pauVar43 + 1;
            lVar33 = lVar33 + 4;
          } while (lVar1 - lVar33 != 0);
        }
        uVar20 = uVar19 + 3;
        uVar19 = uVar19 + 2;
      }
      if ((int)uVar19 < (int)uVar13) {
        do {
          uVar31 = uVar44;
          if (0 < (int)uVar2) {
            do {
              auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
              auVar53 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
              in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])*pauVar43 = auVar53;
              pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x20);
              uVar31 = uVar31 - 1;
            } while (uVar31 != 0);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar13);
      }
      uVar31 = uVar50 + 8;
      lVar33 = uVar50 + 0xf;
      local_138._0_4_ = (int)local_138 + iVar26;
      iVar15 = iVar15 + iVar26;
      iVar14 = iVar14 + iVar26;
      local_140._0_4_ = (uint)local_140 + iVar26;
      local_108._0_4_ = (int)local_108 + iVar26;
      local_e0 = local_e0 + iVar26;
      local_e8 = local_e8 + iVar26;
      iVar21 = iVar21 + iVar26;
      uVar50 = uVar31;
    } while (lVar33 < (long)uVar48);
    uVar31 = uVar31 & 0xffffffff;
  }
  uVar19 = (uint)uVar31;
  if ((int)(uVar19 | 3) < (int)uVar24) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxbd_avx512f(_DAT_005a6a50);
    auVar51 = vpmulld_avx(auVar51,auVar55._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar55._0_32_);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    lVar33 = (long)(int)(uVar2 * 8);
    auVar52 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar52,auVar51);
    local_140._0_4_ = uVar13 & 0xfffffff0;
    lVar1 = uVar44 * 4;
    local_128 = uVar2 * uVar13;
    iVar26 = local_128 * 4;
    iVar14 = (uVar19 + 2) * local_128;
    local_118 = (uVar19 + 1) * local_128;
    local_128 = local_128 * (uVar19 | 3);
    lVar17 = (long)(int)(uVar2 << 4) * 4;
    iVar15 = uVar19 * uVar2 * uVar13;
    uVar31 = uVar31 & 0xffffffff;
    do {
      pvVar18 = (this->super_Convolution1D).weight_data.data;
      pauVar43 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)(((uint)(uVar31 >> 3) & 1) + ((uint)(uVar31 >> 4) & 0xfffffff) +
                         (uint)(((uint)uVar31 >> 2 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar13 < 0x10) {
        uVar19 = 0;
      }
      else {
        pvVar49 = (void *)((long)local_128 * 4 + (long)pvVar18);
        pvVar23 = (void *)((long)iVar14 * 4 + (long)pvVar18);
        pvVar22 = (void *)((long)local_118 * 4 + (long)pvVar18);
        pvVar18 = (void *)((long)iVar15 * 4 + (long)pvVar18);
        iVar21 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar47 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar18 + lVar33 * 0x10 + lVar47));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar22 + lVar33 * 0x10 + lVar47));
              auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar23 + lVar33 * 0x10 + lVar47));
              auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar49 + lVar33 * 0x10 + lVar47));
              auVar59 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklps_avx512f(auVar57,auVar58);
              auVar57 = vunpckhps_avx512f(auVar57,auVar58);
              auVar58 = vunpcklpd_avx512f(auVar59,auVar56);
              auVar56 = vunpckhpd_avx512f(auVar59,auVar56);
              auVar59 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vshuff64x2_avx512f(auVar58,auVar56,0x88);
              auVar60 = vshuff64x2_avx512f(auVar59,auVar55,0x88);
              in_ZMM5 = vshuff64x2_avx512f(auVar58,auVar56,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar59,auVar55,0xdd);
              in_ZMM7 = vshuff64x2_avx512f(auVar57,auVar60,0x88);
              in_ZMM8 = vshuff64x2_avx512f(in_ZMM5,auVar55,0x88);
              in_ZMM6 = vshuff64x2_avx512f(auVar57,auVar60,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar55,0xdd);
              *pauVar43 = in_ZMM7;
              pauVar43[1] = in_ZMM8;
              pauVar43[2] = in_ZMM6;
              pauVar43[3] = in_ZMM4;
              pauVar43 = pauVar43 + 4;
              lVar47 = lVar47 + 4;
            } while (lVar1 - lVar47 != 0);
          }
          pvVar18 = (void *)((long)pvVar18 + lVar17);
          pvVar22 = (void *)((long)pvVar22 + lVar17);
          pvVar23 = (void *)((long)pvVar23 + lVar17);
          pvVar49 = (void *)((long)pvVar49 + lVar17);
          iVar27 = iVar21 + 0x1f;
          iVar21 = iVar21 + 0x10;
          uVar19 = (uint)local_140;
        } while (iVar27 < (int)uVar13);
      }
      uVar20 = uVar19 | 7;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar54 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
            auVar79 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
            auVar80 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
            auVar82 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            auVar53 = vunpcklps_avx(auVar54,auVar79);
            auVar54 = vunpckhps_avx(auVar54,auVar79);
            auVar81 = vunpcklps_avx(auVar80,auVar82);
            auVar79 = vunpckhps_avx(auVar80,auVar82);
            auVar80 = vunpcklpd_avx(auVar53,auVar81);
            in_ZMM7 = ZEXT3264(auVar80);
            auVar53 = vunpckhpd_avx(auVar53,auVar81);
            auVar81 = vunpcklpd_avx(auVar54,auVar79);
            in_ZMM8 = ZEXT3264(auVar81);
            auVar54 = vunpckhpd_avx(auVar54,auVar79);
            auVar79._16_16_ = auVar53._0_16_;
            auVar79._0_16_ = auVar80._0_16_;
            in_ZMM6 = ZEXT3264(auVar79);
            auVar82._16_16_ = auVar54._0_16_;
            auVar82._0_16_ = auVar81._0_16_;
            auVar53 = vperm2f128_avx(auVar80,auVar53,0x31);
            in_ZMM5 = ZEXT3264(auVar53);
            auVar54 = vperm2f128_avx(auVar81,auVar54,0x31);
            in_ZMM4 = ZEXT3264(auVar54);
            *(undefined1 (*) [32])*pauVar43 = auVar79;
            *(undefined1 (*) [32])((long)*pauVar43 + 0x20) = auVar82;
            *(undefined1 (*) [32])pauVar43[1] = auVar53;
            *(undefined1 (*) [32])(pauVar43[1] + 0x20) = auVar54;
            pauVar43 = pauVar43 + 2;
            lVar47 = lVar47 + 4;
          } while (lVar1 - lVar47 != 0);
        }
        uVar20 = uVar19 + 0xf;
        uVar19 = uVar19 + 8;
      }
      uVar20 = uVar19 | 3;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          do {
            auVar51 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
            auVar8 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar51 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
            auVar9 = vgatherdps((undefined1  [16])0x0,auVar51);
            auVar51 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
            auVar10 = vgatherdps((undefined1  [16])0x0,auVar51);
            auVar51 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
            auVar51 = vgatherdps((undefined1  [16])0x0,auVar51);
            auVar52 = vunpcklps_avx(auVar8,auVar9);
            auVar5 = vunpcklps_avx(auVar10,auVar51);
            auVar8 = vunpckhps_avx(auVar8,auVar9);
            auVar9 = vunpckhps_avx(auVar10,auVar51);
            in_ZMM5 = ZEXT1664(auVar9);
            auVar51 = vmovlhps_avx(auVar52,auVar5);
            in_ZMM6 = ZEXT1664(auVar51);
            auVar5 = vunpckhpd_avx(auVar52,auVar5);
            in_ZMM7 = ZEXT1664(auVar5);
            auVar52 = vmovlhps_avx(auVar8,auVar9);
            in_ZMM8 = ZEXT1664(auVar52);
            auVar8 = vunpckhpd_avx(auVar8,auVar9);
            in_ZMM4 = ZEXT1664(auVar8);
            *(undefined1 (*) [16])*pauVar43 = auVar51;
            *(undefined1 (*) [16])((long)*pauVar43 + 0x10) = auVar5;
            *(undefined1 (*) [16])((long)*pauVar43 + 0x20) = auVar52;
            *(undefined1 (*) [16])((long)*pauVar43 + 0x30) = auVar8;
            pauVar43 = pauVar43 + 1;
            lVar47 = lVar47 + 4;
          } while (lVar1 - lVar47 != 0);
        }
        uVar20 = uVar19 + 7;
        uVar19 = uVar19 + 4;
      }
      uVar20 = uVar19 | 1;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          do {
            auVar51 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
            auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            *(undefined1 (*) [16])*pauVar43 = auVar51;
            auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar51 = vgatherdps(ZEXT816(0) << 0x20,auVar51);
            in_ZMM4 = ZEXT1664(auVar51);
            in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])((long)*pauVar43 + 0x10) = auVar51;
            pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x20);
            lVar47 = lVar47 + 4;
          } while (lVar1 - lVar47 != 0);
        }
        uVar20 = uVar19 + 3;
        uVar19 = uVar19 + 2;
      }
      if ((int)uVar19 < (int)uVar13) {
        do {
          uVar50 = uVar44;
          if (0 < (int)uVar2) {
            do {
              auVar51 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
              auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
              in_ZMM4 = ZEXT1664(auVar51);
              in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])*pauVar43 = auVar51;
              pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x10);
              uVar50 = uVar50 - 1;
            } while (uVar50 != 0);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar13);
      }
      uVar50 = uVar31 + 4;
      lVar47 = uVar31 + 7;
      local_128 = local_128 + iVar26;
      iVar14 = iVar14 + iVar26;
      local_118 = local_118 + iVar26;
      iVar15 = iVar15 + iVar26;
      uVar31 = uVar50;
    } while (lVar47 < (long)uVar48);
    uVar19 = (uint)uVar50;
  }
  uVar20 = uVar19 | 1;
  if ((int)uVar20 < (int)uVar24) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar55 = vpmovsxbd_avx512f(_DAT_005a6a50);
    vpmulld_avx(auVar51,auVar55._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar55._0_32_);
    auVar56 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar56,auVar55);
    lVar33 = (long)(int)(uVar2 * 8);
    local_100 = uVar13 & 0xfffffff0;
    lVar1 = uVar44 * 4;
    local_150 = uVar2 * uVar13 * uVar20;
    iVar26 = uVar2 * uVar13 * 2;
    lVar17 = (long)(int)(uVar2 << 4) * 4;
    iVar15 = uVar19 * uVar2 * uVar13;
    lVar47 = (long)(int)(uVar2 * 4) * 4;
    lVar35 = (long)(int)(uVar2 * 2) * 4;
    uVar31 = (long)(int)uVar19;
    do {
      uVar19 = (uint)uVar31;
      pvVar18 = (this->super_Convolution1D).weight_data.data;
      pauVar43 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)(((uint)(uVar31 >> 2) & 1) +
                          ((uint)(uVar31 >> 4) & 0xfffffff) + (uint)((uVar19 >> 3 & 1) != 0) +
                         (uint)((uVar19 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar13 < 0x10) {
        pvVar22 = (void *)((long)pvVar18 + (long)(int)(uVar13 * uVar2 * uVar19) * 4);
        pvVar23 = (void *)((long)pvVar18 + (long)(int)(uVar20 * uVar13 * uVar2) * 4);
        uVar19 = 0;
      }
      else {
        pvVar23 = (void *)((long)local_150 * 4 + (long)pvVar18);
        pvVar22 = (void *)((long)iVar15 * 4 + (long)pvVar18);
        iVar14 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar40 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar22 + lVar33 * 0x10 + lVar40));
              in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar23 + lVar33 * 0x10 + lVar40));
              *pauVar43 = auVar55;
              pauVar43[1] = in_ZMM4;
              pauVar43 = pauVar43 + 2;
              lVar40 = lVar40 + 4;
            } while (lVar1 - lVar40 != 0);
          }
          pvVar22 = (void *)((long)pvVar22 + lVar17);
          pvVar23 = (void *)((long)pvVar23 + lVar17);
          iVar21 = iVar14 + 0x1f;
          iVar14 = iVar14 + 0x10;
          uVar19 = local_100;
        } while (iVar21 < (int)uVar13);
      }
      uVar20 = uVar19 | 7;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar40 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar54 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
            auVar53 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar53 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar53);
            in_ZMM4 = ZEXT3264(auVar53);
            in_ZMM5 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar43 = auVar54;
            *(undefined1 (*) [32])((long)*pauVar43 + 0x20) = auVar53;
            pauVar43 = pauVar43 + 1;
            lVar40 = lVar40 + 4;
          } while (lVar1 - lVar40 != 0);
        }
        pvVar22 = (void *)((long)pvVar22 + lVar33 * 4);
        pvVar23 = (void *)((long)pvVar23 + lVar33 * 4);
        uVar20 = uVar19 + 0xf;
        uVar19 = uVar19 + 8;
      }
      uVar20 = uVar19 | 3;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar40 = 0;
          do {
            auVar51 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar52 = vgatherdps((undefined1  [16])0x0,auVar51);
            auVar51 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
            auVar51 = vgatherdps((undefined1  [16])0x0,auVar51);
            in_ZMM4 = ZEXT1664(auVar51);
            in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar43 = auVar52;
            *(undefined1 (*) [16])((long)*pauVar43 + 0x10) = auVar51;
            pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x20);
            lVar40 = lVar40 + 4;
          } while (lVar1 - lVar40 != 0);
        }
        pvVar22 = (void *)((long)pvVar22 + lVar47);
        pvVar23 = (void *)((long)pvVar23 + lVar47);
        uVar20 = uVar19 + 7;
        uVar19 = uVar19 + 4;
      }
      uVar20 = uVar19 | 1;
      while ((int)uVar20 < (int)uVar13) {
        if (0 < (int)uVar2) {
          uVar50 = 0;
          pvVar18 = pvVar22;
          pvVar49 = pvVar23;
          do {
            lVar40 = 0;
            bVar12 = true;
            do {
              bVar41 = bVar12;
              *(undefined4 *)*pauVar43 = *(undefined4 *)((long)pvVar18 + lVar40);
              *(undefined4 *)((long)*pauVar43 + 4) = *(undefined4 *)((long)pvVar49 + lVar40);
              pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 8);
              lVar40 = lVar40 + lVar32 * 4;
              bVar12 = false;
            } while (bVar41);
            uVar50 = uVar50 + 1;
            pvVar49 = (void *)((long)pvVar49 + 4);
            pvVar18 = (void *)((long)pvVar18 + 4);
          } while (uVar50 != uVar44);
        }
        pvVar22 = (void *)((long)pvVar22 + lVar35);
        pvVar23 = (void *)((long)pvVar23 + lVar35);
        uVar20 = uVar19 + 3;
        uVar19 = uVar19 + 2;
      }
      if ((int)uVar19 < (int)uVar13) {
        do {
          if (0 < (int)uVar2) {
            uVar50 = 0;
            do {
              *(undefined4 *)*pauVar43 = *(undefined4 *)((long)pvVar22 + uVar50 * 4);
              *(undefined4 *)((long)*pauVar43 + 4) = *(undefined4 *)((long)pvVar23 + uVar50 * 4);
              pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 8);
              uVar50 = uVar50 + 1;
            } while (uVar44 != uVar50);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar13);
      }
      uVar50 = uVar31 + 2;
      lVar40 = uVar31 + 3;
      uVar20 = (uint)lVar40;
      local_150 = local_150 + iVar26;
      iVar15 = iVar15 + iVar26;
      uVar31 = uVar50;
    } while (lVar40 < (long)uVar48);
    uVar19 = (uint)uVar50;
  }
  if ((int)uVar19 < (int)uVar24) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar56 = vpmovsxbd_avx512f(_DAT_005a6a50);
    vpmulld_avx(auVar51,auVar56._0_16_);
    auVar53 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar53,auVar56._0_32_);
    auVar55 = vpbroadcastd_avx512f();
    vpmulld_avx512f(auVar55,auVar56);
    uVar31 = (ulong)(int)uVar19;
    lVar1 = uVar44 * 4;
    iVar26 = uVar19 * uVar2 * uVar13;
    lVar17 = (long)(int)(uVar2 * 2) * 4;
    do {
      uVar24 = (uint)uVar31;
      pvVar18 = (this->super_Convolution1D).weight_data.data;
      pauVar43 = (undefined1 (*) [64])
                 ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                  (ulong)((uVar24 & 1) + ((uint)(uVar31 >> 4) & 0xfffffff) +
                          (uint)((uVar24 >> 3 & 1) != 0) + ((uint)(uVar31 >> 2) & 1) +
                         (uint)((uVar24 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
      if ((int)uVar13 < 0x10) {
        pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar13 * uVar2 * uVar24) * 4);
        uVar24 = 0;
      }
      else {
        pvVar18 = (void *)((long)pvVar18 + (long)iVar26 * 4);
        iVar15 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar33 = 0;
            do {
              auVar55 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar18 + (long)(int)(uVar2 * 8) * 0x10 + lVar33)
                                          );
              *pauVar43 = auVar55;
              pauVar43 = pauVar43 + 1;
              lVar33 = lVar33 + 4;
            } while (lVar1 - lVar33 != 0);
          }
          pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar2 << 4) * 4);
          iVar14 = iVar15 + 0x1f;
          iVar15 = iVar15 + 0x10;
          uVar24 = uVar13 & 0xfffffff0;
        } while (iVar14 < (int)uVar13);
      }
      uVar19 = uVar24 | 7;
      iVar15 = uVar19 - uVar13;
      while (SBORROW4(uVar19,uVar13) != iVar15 < 0) {
        if (0 < (int)uVar2) {
          lVar33 = 0;
          do {
            auVar53 = vpcmpeqd_avx2(auVar55._0_32_,auVar55._0_32_);
            auVar53 = vgatherdps(ZEXT832(0) << 0x40,auVar53);
            auVar55 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar43 = auVar53;
            pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x20);
            lVar33 = lVar33 + 4;
          } while (lVar1 - lVar33 != 0);
        }
        pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar2 * 8) * 4);
        uVar19 = uVar24 + 0xf;
        uVar24 = uVar24 + 8;
        iVar15 = uVar19 - uVar13;
      }
      uVar19 = uVar24 | 3;
      while ((int)uVar19 < (int)uVar13) {
        if (0 < (int)uVar2) {
          lVar33 = 0;
          do {
            auVar51 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
            auVar51 = vgatherdps(ZEXT816(0) << 0x40,auVar51);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar43 = auVar51;
            pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 0x10);
            lVar33 = lVar33 + 4;
          } while (lVar1 - lVar33 != 0);
        }
        pvVar18 = (void *)((long)pvVar18 + (long)(int)(uVar2 * 4) * 4);
        uVar19 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      if ((int)(uVar24 | 1) < (int)uVar13) {
        pvVar22 = (void *)((long)pvVar18 + lVar32 * 4);
        uVar19 = uVar24;
        do {
          if (0 < (int)uVar2) {
            uVar50 = 0;
            do {
              *(undefined4 *)*pauVar43 = *(undefined4 *)((long)pvVar18 + uVar50 * 4);
              uVar24 = *(uint *)((long)pvVar22 + uVar50 * 4);
              auVar55 = ZEXT464(uVar24);
              *(uint *)((long)*pauVar43 + 4) = uVar24;
              pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + 8);
              uVar50 = uVar50 + 1;
            } while (uVar44 != uVar50);
          }
          pvVar18 = (void *)((long)pvVar18 + lVar17);
          uVar24 = uVar19 + 2;
          iVar15 = uVar19 + 3;
          pvVar22 = (void *)((long)pvVar22 + lVar17);
          uVar19 = uVar24;
        } while (iVar15 < (int)uVar13);
      }
      if ((int)uVar24 < (int)uVar13) {
        do {
          if (0 < (int)uVar2) {
            lVar33 = 0;
            do {
              auVar55 = ZEXT464(*(uint *)((long)pvVar18 + lVar33));
              *(uint *)((long)*pauVar43 + lVar33) = *(uint *)((long)pvVar18 + lVar33);
              lVar33 = lVar33 + 4;
            } while (lVar1 - lVar33 != 0);
            pauVar43 = (undefined1 (*) [64])((long)*pauVar43 + lVar33);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar13);
      }
      uVar31 = uVar31 + 1;
      iVar26 = iVar26 + uVar2 * uVar13;
    } while (uVar31 != uVar48);
  }
  if (opt->lightmode == true) {
    piVar3 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar18 = (this->super_Convolution1D).weight_data.data;
        pAVar4 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar18 != (void *)0x0) {
            free(pvVar18);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}